

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

HTTPResponse * get404Response(void)

{
  HTTPResponse *in_RDI;
  string *in_stack_000001c0;
  string *in_stack_000001c8;
  string *in_stack_000001d0;
  int in_stack_000001dc;
  HTTPResponse *in_stack_000001e0;
  allocator<char> local_89;
  string local_88 [8];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_61;
  string local_60 [55];
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  HTTPResponse::HTTPResponse
            (in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8,
             in_stack_000001c0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return in_RDI;
}

Assistant:

HTTPResponse get404Response()
{
    return HTTPResponse(404, "Not Found", "text/html", "Page Not Found");
}